

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O3

bool cmGetSourceFilePropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *prop;
  pointer pbVar1;
  long *plVar2;
  string *name;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  long lVar6;
  cmSourceFile *this;
  cmValue cVar7;
  string *psVar8;
  bool source_file_directory_option_enabled;
  int iVar9;
  undefined1 auVar11 [16];
  string_view value;
  string_view value_00;
  string file;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  _Any_data local_c0;
  undefined1 local_b0 [24];
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> local_98;
  undefined1 local_78 [16];
  pointer local_68;
  undefined1 local_58 [16];
  pointer local_48;
  cmMakefile *local_38;
  int iVar10;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if ((lVar6 >> 5 != 3) && (lVar6 >> 5 != 5)) {
    local_c0._M_unused._M_object = local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_c0._M_unused._0_8_ != local_b0) {
      operator_delete(local_c0._M_unused._M_object,(ulong)(local_b0._0_8_ + 1));
    }
    return false;
  }
  local_58 = (undefined1  [16])0x0;
  local_48 = (pointer)0x0;
  local_68 = (pointer)0x0;
  local_78 = (undefined1  [16])0x0;
  plVar2 = (long *)pbVar1[2]._M_dataplus._M_p;
  iVar10 = 2;
  iVar9 = 2;
  if (pbVar1[2]._M_string_length == 0x10) {
    auVar11[0] = -((char)*plVar2 == 'T');
    auVar11[1] = -(*(char *)((long)plVar2 + 1) == 'A');
    auVar11[2] = -(*(char *)((long)plVar2 + 2) == 'R');
    auVar11[3] = -(*(char *)((long)plVar2 + 3) == 'G');
    auVar11[4] = -(*(char *)((long)plVar2 + 4) == 'E');
    auVar11[5] = -(*(char *)((long)plVar2 + 5) == 'T');
    auVar11[6] = -(*(char *)((long)plVar2 + 6) == '_');
    auVar11[7] = -(*(char *)((long)plVar2 + 7) == 'D');
    auVar11[8] = -((char)plVar2[1] == 'I');
    auVar11[9] = -(*(char *)((long)plVar2 + 9) == 'R');
    auVar11[10] = -(*(char *)((long)plVar2 + 10) == 'E');
    auVar11[0xb] = -(*(char *)((long)plVar2 + 0xb) == 'C');
    auVar11[0xc] = -(*(char *)((long)plVar2 + 0xc) == 'T');
    auVar11[0xd] = -(*(char *)((long)plVar2 + 0xd) == 'O');
    auVar11[0xe] = -(*(char *)((long)plVar2 + 0xe) == 'R');
    auVar11[0xf] = -(*(char *)((long)plVar2 + 0xf) == 'Y');
    source_file_directory_option_enabled = false;
    bVar4 = false;
    if (lVar6 != 0xa0) goto LAB_003f4f78;
    bVar4 = false;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) == 0xffff) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78,pbVar1 + 3);
      bVar4 = true;
      iVar9 = 4;
      source_file_directory_option_enabled = false;
    }
  }
  else {
    bVar4 = false;
    if (pbVar1[2]._M_string_length == 9) {
      source_file_directory_option_enabled = false;
      bVar4 = false;
      if (lVar6 == 0xa0) {
        bVar4 = false;
        if ((char)plVar2[1] != 'Y' || *plVar2 != 0x524f544345524944) goto LAB_003f4f7b;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58,pbVar1 + 3);
        iVar10 = 4;
        bVar4 = true;
      }
    }
LAB_003f4f78:
    source_file_directory_option_enabled = bVar4;
    iVar9 = iVar10;
    bVar4 = false;
  }
LAB_003f4f7b:
  local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                    (status,source_file_directory_option_enabled,bVar4,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,&local_98);
  if (bVar3) {
    name = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    prop = (string *)((long)&(name->_M_dataplus)._M_p + (ulong)(uint)(iVar9 << 5));
    local_b0._16_8_ =
         *local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_start;
    psVar8 = name;
    if ((*(long *)((long)&name->_M_string_length + (ulong)(uint)(iVar9 << 5)) == 9) &&
       (plVar2 = (long *)(prop->_M_dataplus)._M_p,
       (char)plVar2[1] == 'D' && *plVar2 == 0x45544152454e4547)) {
      local_38 = status->Makefile;
      PVar5 = cmMakefile::GetPolicyStatus((cmMakefile *)local_b0._16_8_,CMP0163,false);
      psVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (WARN < PVar5) {
        local_c0._8_8_ = local_38;
        local_b0._8_8_ =
             std::
             _Function_handler<bool_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGetSourceFilePropertyCommand.cxx:73:22)>
             ::_M_invoke;
        local_b0._0_8_ =
             std::
             _Function_handler<bool_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGetSourceFilePropertyCommand.cxx:73:22)>
             ::_M_manager;
        local_c0._M_unused._M_object = name;
        bVar4 = GetPropertyCommand::GetSourceFilePropertyGENERATED
                          (psVar8 + 1,local_38,(function<bool_(bool)> *)&local_c0);
        if ((code *)local_b0._0_8_ != (code *)0x0) {
          (*(code *)local_b0._0_8_)(&local_c0,&local_c0,3);
        }
        goto LAB_003f50d1;
      }
    }
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
              ((string *)&local_c0,status,psVar8 + 1,
               (bool)(source_file_directory_option_enabled | bVar4));
    this = cmMakefile::GetSource((cmMakefile *)local_b0._16_8_,(string *)&local_c0,Ambiguous);
    if (((this == (cmSourceFile *)0x0) &&
        (((prop->_M_string_length != 8 || (*(long *)(prop->_M_dataplus)._M_p != 0x4e4f495441434f4c))
         || (this = cmMakefile::CreateSource
                              ((cmMakefile *)local_b0._16_8_,(string *)&local_c0,false,Ambiguous),
            this == (cmSourceFile *)0x0)))) ||
       ((prop->_M_string_length == 0 ||
        (cVar7 = cmSourceFile::GetPropertyForUser(this,prop), cVar7.Value == (string *)0x0)))) {
      value_00._M_str = "NOTFOUND";
      value_00._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value_00);
    }
    else {
      value._M_str = ((cVar7.Value)->_M_dataplus)._M_p;
      value._M_len = (cVar7.Value)->_M_string_length;
      cmMakefile::AddDefinition(status->Makefile,name,value);
    }
    if ((string *)local_c0._M_unused._0_8_ != (string *)local_b0) {
      operator_delete(local_c0._M_unused._M_object,(ulong)(local_b0._0_8_ + 1));
    }
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
LAB_003f50d1:
  if (local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return bVar4;
}

Assistant:

bool cmGetSourceFilePropertyCommand(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  std::vector<std::string>::size_type args_size = args.size();
  if (args_size != 3 && args_size != 5) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  int property_arg_index = 2;
  if (args[2] == "DIRECTORY"_s && args_size == 5) {
    property_arg_index = 4;
    source_file_directory_option_enabled = true;
    source_file_directories.push_back(args[3]);
  } else if (args[2] == "TARGET_DIRECTORY"_s && args_size == 5) {
    property_arg_index = 4;
    source_file_target_option_enabled = true;
    source_file_target_directories.push_back(args[3]);
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  std::string const& var = args[0];
  std::string const& propName = args[property_arg_index];
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;
  cmMakefile& directory_makefile = *source_file_directory_makefiles[0];

  // Special handling for GENERATED property.
  // Note: Only, if CMP0163 is set to NEW!
  if (propName == "GENERATED"_s) {
    auto& mf = status.GetMakefile();
    auto cmp0163 = directory_makefile.GetPolicyStatus(cmPolicies::CMP0163);
    bool const cmp0163new =
      cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
    if (cmp0163new) {
      return GetPropertyCommand::GetSourceFilePropertyGENERATED(
        args[1], mf, [&var, &mf](bool isGenerated) -> bool {
          // Set the value on the original Makefile scope, not the scope of the
          // requested directory.
          mf.AddDefinition(var, (isGenerated) ? cmValue("1") : cmValue("0"));
          return true;
        });
    }
  }

  // Get the source file.
  std::string const file =
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded(
      status, args[1], source_file_paths_should_be_absolute);
  cmSourceFile* sf = directory_makefile.GetSource(file);

  // for the location we must create a source file first
  if (!sf && propName == "LOCATION"_s) {
    sf = directory_makefile.CreateSource(file);
  }

  if (sf) {
    cmValue prop = nullptr;
    if (!propName.empty()) {
      prop = sf->GetPropertyForUser(propName);
    }
    if (prop) {
      // Set the value on the original Makefile scope, not the scope of the
      // requested directory.
      status.GetMakefile().AddDefinition(var, *prop);
      return true;
    }
  }

  // Set the value on the original Makefile scope, not the scope of the
  // requested directory.
  status.GetMakefile().AddDefinition(var, "NOTFOUND");
  return true;
}